

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O1

bool dxil_spv::emit_physical_buffer_load_instruction
               (Impl *impl,CallInst *instruction,PhysicalPointerMeta *ptr_meta,uint32_t mask,
               uint32_t alignment)

{
  uint32_t uVar1;
  Builder *this;
  bool bVar2;
  uint8_t uVar3;
  Id IVar4;
  uint uVar5;
  Id IVar6;
  Id arg;
  Type *pTVar7;
  Value *value;
  Operation *pOVar8;
  Operation *this_00;
  mapped_type *pmVar9;
  LoggingCallback p_Var10;
  void *pvVar11;
  uint uVar12;
  Id physical_type_id;
  Op value_cast_op;
  PhysicalPointerMeta tmp_ptr_meta;
  Id local_1074;
  uint32_t local_1070;
  uint32_t local_106c;
  uint local_1068;
  Op local_1064;
  Builder *local_1060;
  uint32_t local_1054;
  Type *local_1050;
  PhysicalPointerMeta *local_1048;
  CallInst *local_1040;
  PhysicalPointerMeta local_1038 [342];
  
  local_1070 = mask;
  local_106c = alignment;
  local_1048 = ptr_meta;
  local_1060 = Converter::Impl::builder(impl);
  if (((local_1070 == 0) &&
      (bVar2 = get_constant_operand(&instruction->super_Instruction,4,&local_1070), !bVar2)) ||
     ((local_106c == 0 &&
      (bVar2 = get_constant_operand(&instruction->super_Instruction,5,&local_106c), !bVar2)))) {
LAB_00177217:
    bVar2 = false;
  }
  else {
    uVar1 = local_1070;
    uVar12 = 1;
    if (local_1070 != 1) {
      if (local_1070 == 3) {
        uVar12 = 2;
      }
      else if (local_1070 == 0xf) {
        uVar12 = 4;
      }
      else {
        if (local_1070 != 7) {
          p_Var10 = get_thread_log_callback();
          if (p_Var10 != (LoggingCallback)0x0) {
            snprintf(&local_1038[0].nonwritable,0x1000,"Unexpected mask for RawBufferLoad = %u.\n",
                     (ulong)local_1070);
            pvVar11 = get_thread_log_callback_userdata();
            (*p_Var10)(pvVar11,Error,&local_1038[0].nonwritable);
            return false;
          }
          emit_physical_buffer_load_instruction();
          goto LAB_00177217;
        }
        uVar12 = 3;
      }
    }
    pTVar7 = LLVMBC::Value::getType((Value *)instruction);
    pTVar7 = LLVMBC::Type::getStructElementType(pTVar7,0);
    IVar4 = build_vectorized_physical_load_store_access(impl,instruction,uVar12,pTVar7);
    local_1050 = pTVar7;
    get_physical_load_store_cast_info(impl,pTVar7,&local_1074,&local_1064);
    if (uVar1 != 1) {
      local_1074 = spv::Builder::makeVectorType(local_1060,local_1074,uVar12);
    }
    local_1038[0].size = local_1048->size;
    local_1038[0].nonwritable = local_1048->nonwritable;
    local_1038[0].nonreadable = local_1048->nonreadable;
    local_1038[0].coherent = local_1048->coherent;
    local_1038[0].rov = local_1048->rov;
    local_1038[0].stride = local_1048->stride;
    local_1038[0]._5_3_ = *(undefined3 *)&local_1048->field_0x5;
    local_1068 = uVar12;
    if (IVar4 == 0) {
      uVar3 = '\0';
    }
    else {
      uVar5 = get_type_scalar_alignment(impl,local_1050);
      uVar3 = (char)uVar5 * (char)uVar12;
    }
    local_1038[0].stride = uVar3;
    IVar6 = Converter::Impl::get_physical_pointer_block_type(impl,local_1074,local_1038);
    local_1054 = uVar1;
    if (IVar4 == 0) {
      arg = build_physical_pointer_address_for_raw_load_store(impl,instruction);
    }
    else {
      value = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,1);
      arg = Converter::Impl::get_id_for_value(impl,value,0);
    }
    emit_buffer_synchronization_validation(impl,instruction,Load);
    pOVar8 = Converter::Impl::allocate(impl,OpBitcast,IVar6);
    Operation::add_id(pOVar8,arg);
    Converter::Impl::add(impl,pOVar8,false);
    this = local_1060;
    IVar6 = spv::Builder::makePointer(local_1060,StorageClassPhysicalStorageBuffer,local_1074);
    this_00 = Converter::Impl::allocate(impl,OpInBoundsAccessChain,IVar6);
    Operation::add_id(this_00,pOVar8->id);
    IVar6 = spv::Builder::makeIntegerType(this,0x20,false);
    IVar6 = spv::Builder::makeIntConstant(this,IVar6,0,false);
    Operation::add_id(this_00,IVar6);
    if (IVar4 != 0) {
      Operation::add_id(this_00,IVar4);
    }
    Converter::Impl::add(impl,this_00,false);
    pOVar8 = Converter::Impl::allocate(impl,OpLoad,local_1074);
    Operation::add_id(pOVar8,this_00->id);
    Operation::add_literal(pOVar8,2);
    Operation::add_literal(pOVar8,local_106c);
    Converter::Impl::add(impl,pOVar8,local_1048->rov);
    uVar1 = local_1054;
    IVar4 = pOVar8->id;
    uVar12 = local_1068;
    if (local_1064 != OpNop) {
      IVar6 = Converter::Impl::get_type_id(impl,local_1050,0);
      uVar12 = local_1068;
      if (uVar1 != 1) {
        IVar6 = spv::Builder::makeVectorType(local_1060,IVar6,local_1068);
      }
      pOVar8 = Converter::Impl::allocate(impl,local_1064,IVar6);
      Operation::add_id(pOVar8,IVar4);
      Converter::Impl::add(impl,pOVar8,false);
      IVar4 = pOVar8->id;
    }
    Converter::Impl::rewrite_value(impl,(Value *)instruction,IVar4);
    if (uVar1 == 1) {
      local_1040 = instruction;
      pmVar9 = std::__detail::
               _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_dxil_spv::Converter::Impl::CompositeMeta>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&impl->llvm_composite_meta,(key_type *)&local_1040);
      pmVar9->forced_composite = false;
    }
    build_exploded_composite_from_vector(impl,&instruction->super_Instruction,uVar12);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

static bool emit_physical_buffer_load_instruction(Converter::Impl &impl, const llvm::CallInst *instruction,
                                                  const Converter::Impl::PhysicalPointerMeta &ptr_meta,
                                                  uint32_t mask = 0, uint32_t alignment = 0)
{
	auto &builder = impl.builder();

	if (mask == 0 && !get_constant_operand(instruction, 4, &mask))
		return false;
	if (alignment == 0 && !get_constant_operand(instruction, 5, &alignment))
		return false;

	unsigned vecsize = 0;
	if (mask == 1)
		vecsize = 1;
	else if (mask == 3)
		vecsize = 2;
	else if (mask == 7)
		vecsize = 3;
	else if (mask == 15)
		vecsize = 4;
	else
	{
		LOGE("Unexpected mask for RawBufferLoad = %u.\n", mask);
		return false;
	}

	auto *element_type = instruction->getType()->getStructElementType(0);
	// If we can express this as a plain access chain, do so for clarity and ideally better perf.
	// If we cannot do it trivially, fallback to raw pointer arithmetic.
	spv::Id array_id = build_vectorized_physical_load_store_access(impl, instruction, vecsize, element_type);

	spv::Id physical_type_id;
	spv::Op value_cast_op;
	get_physical_load_store_cast_info(impl, element_type, physical_type_id, value_cast_op);

	if (vecsize > 1)
		physical_type_id = builder.makeVectorType(physical_type_id, vecsize);

	auto tmp_ptr_meta = ptr_meta;
	tmp_ptr_meta.stride = array_id ? vecsize * get_type_scalar_alignment(impl, element_type) : 0;
	spv::Id ptr_type_id = impl.get_physical_pointer_block_type(physical_type_id, tmp_ptr_meta);

	spv::Id u64_ptr_id;
	if (array_id)
		u64_ptr_id = impl.get_id_for_value(instruction->getOperand(1));
	else
		u64_ptr_id = build_physical_pointer_address_for_raw_load_store(impl, instruction);

	emit_buffer_synchronization_validation(impl, instruction, BDAOperation::Load);

	auto *ptr_bitcast_op = impl.allocate(spv::OpBitcast, ptr_type_id);
	ptr_bitcast_op->add_id(u64_ptr_id);
	impl.add(ptr_bitcast_op);

	auto *chain_op = impl.allocate(spv::OpInBoundsAccessChain,
								   builder.makePointer(spv::StorageClassPhysicalStorageBuffer, physical_type_id));
	chain_op->add_id(ptr_bitcast_op->id);
	chain_op->add_id(builder.makeUintConstant(0));
	if (array_id)
		chain_op->add_id(array_id);
	impl.add(chain_op);

	auto *load_op = impl.allocate(spv::OpLoad, physical_type_id);
	load_op->add_id(chain_op->id);
	load_op->add_literal(spv::MemoryAccessAlignedMask);
	load_op->add_literal(alignment);

	impl.add(load_op, ptr_meta.rov);

	spv::Id loaded_id = load_op->id;

	if (value_cast_op != spv::OpNop)
	{
		spv::Id type_id = impl.get_type_id(element_type);
		if (vecsize > 1)
			type_id = builder.makeVectorType(type_id, vecsize);
		auto *cast_op = impl.allocate(value_cast_op, type_id);
		cast_op->add_id(loaded_id);
		impl.add(cast_op);
		loaded_id = cast_op->id;
	}

	impl.rewrite_value(instruction, loaded_id);

	if (vecsize == 1)
		impl.llvm_composite_meta[instruction].forced_composite = false;

	build_exploded_composite_from_vector(impl, instruction, vecsize);

	return true;
}